

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tensor.cc
# Opt level: O0

void cnn::TensorTools::RandomBernoulli(Tensor *val,real p,real scale)

{
  anon_class_16_2_d80fb611 __gen;
  long in_RDI;
  anon_class_16_2_d80fb611 b;
  bernoulli_distribution distribution;
  double in_stack_ffffffffffffffb8;
  float *__last;
  bernoulli_distribution *in_stack_ffffffffffffffc0;
  Dim *this;
  bernoulli_distribution local_18;
  real local_10 [2];
  long local_8;
  
  local_8 = in_RDI;
  std::bernoulli_distribution::bernoulli_distribution
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  this = *(Dim **)(local_8 + 0x28);
  __last = *(float **)(local_8 + 0x28);
  Dim::size(this);
  __gen.scale = local_10;
  __gen.distribution = &local_18;
  std::generate<float*,cnn::TensorTools::RandomBernoulli(cnn::Tensor&,float,float)::__0>
            ((float *)this,__last,__gen);
  return;
}

Assistant:

void TensorTools::RandomBernoulli(Tensor& val, real p, real scale) {
  bernoulli_distribution distribution(p);
  auto b = [&] {return distribution(*rndeng) * scale;};
  generate(val.v, val.v + val.d.size(), b);
}